

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* testing::internal::ActionResultHolder<std::__cxx11::string>::PerformAction<std::__cxx11::string()>
            (Action<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *action,ArgumentTuple *args)

{
  ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  size_type local_28;
  undefined8 uStack_20;
  
  pAVar1 = (ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x28);
  Action<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  Perform(&local_58,action);
  if (local_58 == &local_48) {
    uStack_20 = uStack_40;
    local_58 = &local_28;
  }
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_001e42c0;
  paVar2 = &(pAVar1->result_).value_.field_2;
  (pAVar1->result_).value_._M_dataplus._M_p = (pointer)paVar2;
  if (local_58 == &local_28) {
    paVar2->_M_allocated_capacity = local_48;
    *(undefined8 *)((long)&(pAVar1->result_).value_.field_2 + 8) = uStack_20;
  }
  else {
    (pAVar1->result_).value_._M_dataplus._M_p = (pointer)local_58;
    (pAVar1->result_).value_.field_2._M_allocated_capacity = local_48;
  }
  (pAVar1->result_).value_._M_string_length = local_50;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }